

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall spirv_cross::SmallVector<bool,_64UL>::SmallVector(SmallVector<bool,_64UL> *this)

{
  bool *pbVar1;
  SmallVector<bool,_64UL> *this_local;
  
  VectorView<bool>::VectorView(&this->super_VectorView<bool>);
  this->buffer_capacity = 0;
  pbVar1 = AlignedBuffer<bool,_64UL>::data(&this->stack_storage);
  (this->super_VectorView<bool>).ptr = pbVar1;
  this->buffer_capacity = 0x40;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}